

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

void __thiscall ftxui::BgColor::Render(BgColor *this,Screen *screen)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Pixel *pPVar4;
  int y;
  int x;
  
  for (y = (this->super_NodeDecorator).super_Node.box_.y_min;
      y <= (this->super_NodeDecorator).super_Node.box_.y_max; y = y + 1) {
    for (x = (this->super_NodeDecorator).super_Node.box_.x_min;
        x <= (this->super_NodeDecorator).super_Node.box_.x_max; x = x + 1) {
      pPVar4 = Screen::PixelAt(screen,x,y);
      uVar1 = (this->super_NodeDecorator).super_Node.field_0x5d;
      uVar2 = (this->super_NodeDecorator).super_Node.field_0x5e;
      uVar3 = (this->super_NodeDecorator).super_Node.field_0x5f;
      (pPVar4->background_color).type_ = (this->super_NodeDecorator).super_Node.field_0x5c;
      (pPVar4->background_color).field_1 = (anon_union_1_2_80bf8522_for_Color_2)uVar1;
      (pPVar4->background_color).green_ = uVar2;
      (pPVar4->background_color).blue_ = uVar3;
    }
  }
  Node::Render((Node *)this,screen);
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y).background_color = color_;
      }
    }
    NodeDecorator::Render(screen);
  }